

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O1

int RSA_public_key_to_bytes(uint8_t **out_bytes,size_t *out_len,RSA *rsa)

{
  int iVar1;
  CBB cbb;
  CBB local_50;
  
  CBB_zero(&local_50);
  iVar1 = CBB_init(&local_50,0);
  if (((iVar1 != 0) && (iVar1 = RSA_marshal_public_key(&local_50,rsa), iVar1 != 0)) &&
     (iVar1 = CBB_finish(&local_50,out_bytes,out_len), iVar1 != 0)) {
    return 1;
  }
  ERR_put_error(4,0,0x79,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                ,0x68);
  CBB_cleanup(&local_50);
  return 0;
}

Assistant:

int RSA_public_key_to_bytes(uint8_t **out_bytes, size_t *out_len,
                            const RSA *rsa) {
  CBB cbb;
  CBB_zero(&cbb);
  if (!CBB_init(&cbb, 0) ||
      !RSA_marshal_public_key(&cbb, rsa) ||
      !CBB_finish(&cbb, out_bytes, out_len)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_ENCODE_ERROR);
    CBB_cleanup(&cbb);
    return 0;
  }
  return 1;
}